

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_queue_remove_active(event_base *base,event_callback *evcb)

{
  int iVar1;
  event_callback *peVar2;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_queue_remove_active_cold_1();
  }
  if ((evcb->evcb_flags & 8U) == 0) {
    event_errx(1,"%s: %p not on queue %x","event_queue_remove_active",evcb,8);
  }
  base->event_count = base->event_count - (uint)((evcb->evcb_flags & 0x10U) == 0);
  *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags & 0xf7;
  base->event_count_active = base->event_count_active + -1;
  peVar2 = (evcb->evcb_active_next).tqe_next;
  if (peVar2 == (event_callback *)0x0) {
    peVar2 = (event_callback *)(base->activequeues + evcb->evcb_pri);
  }
  (peVar2->evcb_active_next).tqe_prev = (evcb->evcb_active_next).tqe_prev;
  *(evcb->evcb_active_next).tqe_prev = (evcb->evcb_active_next).tqe_next;
  return;
}

Assistant:

static void
event_queue_remove_active(struct event_base *base, struct event_callback *evcb)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(evcb->evcb_flags & EVLIST_ACTIVE))) {
		event_errx(1, "%s: %p not on queue %x", __func__,
			   evcb, EVLIST_ACTIVE);
		return;
	}
	DECR_EVENT_COUNT(base, evcb->evcb_flags);
	evcb->evcb_flags &= ~EVLIST_ACTIVE;
	base->event_count_active--;

	TAILQ_REMOVE(&base->activequeues[evcb->evcb_pri],
	    evcb, evcb_active_next);
}